

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

Integer pnga_sprs_array_sprsdns_multiply(Integer s_a,Integer g_b,Integer trans)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  logical lVar12;
  void *__ptr;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  double _ic_7;
  double _rc_7;
  double _ib_7;
  double _rb_7;
  double _ia_7;
  double _ra_7;
  double _ic_6;
  double _rc_6;
  double _ib_6;
  double _rb_6;
  double _ia_6;
  double _ra_6;
  Integer _ncols_13;
  Integer _ld_b_13;
  Integer _kk_13;
  Integer _jj_13;
  Integer _ii_13;
  Integer _k_13;
  Integer _j_13;
  Integer _i_13;
  float _ic_5;
  float _rc_5;
  float _ib_5;
  float _rb_5;
  float _ia_5;
  float _ra_5;
  float _ic_4;
  float _rc_4;
  float _ib_4;
  float _rb_4;
  float _ia_4;
  float _ra_4;
  Integer _ncols_12;
  Integer _ld_b_12;
  Integer _kk_12;
  Integer _jj_12;
  Integer _ii_12;
  Integer _k_12;
  Integer _j_12;
  Integer _i_12;
  Integer _ncols_11;
  Integer _ld_b_11;
  Integer _kk_11;
  Integer _jj_11;
  Integer _ii_11;
  Integer _k_11;
  Integer _j_11;
  Integer _i_11;
  Integer _ncols_10;
  Integer _ld_b_10;
  Integer _kk_10;
  Integer _jj_10;
  Integer _ii_10;
  Integer _k_10;
  Integer _j_10;
  Integer _i_10;
  Integer _ncols_9;
  Integer _ld_b_9;
  Integer _kk_9;
  Integer _jj_9;
  Integer _ii_9;
  Integer _k_9;
  Integer _j_9;
  Integer _i_9;
  Integer _ncols_8;
  Integer _ld_b_8;
  Integer _kk_8;
  Integer _jj_8;
  Integer _ii_8;
  Integer _k_8;
  Integer _j_8;
  Integer _i_8;
  Integer _ncols_7;
  Integer _ld_b_7;
  Integer _kk_7;
  Integer _jj_7;
  Integer _ii_7;
  Integer _k_7;
  Integer _j_7;
  Integer _i_7;
  int64_t *jdx_a_1;
  int64_t *idx_a_1;
  double _ic_3;
  double _rc_3;
  double _ib_3;
  double _rb_3;
  double _ia_3;
  double _ra_3;
  double _ic_2;
  double _rc_2;
  double _ib_2;
  double _rb_2;
  double _ia_2;
  double _ra_2;
  Integer _ncols_6;
  Integer _ld_b_6;
  Integer _kk_6;
  Integer _jj_6;
  Integer _ii_6;
  Integer _k_6;
  Integer _j_6;
  Integer _i_6;
  float _ic_1;
  float _rc_1;
  float _ib_1;
  float _rb_1;
  float _ia_1;
  float _ra_1;
  float _ic;
  float _rc;
  float _ib;
  float _rb;
  float _ia;
  float _ra;
  Integer _ncols_5;
  Integer _ld_b_5;
  Integer _kk_5;
  Integer _jj_5;
  Integer _ii_5;
  Integer _k_5;
  Integer _j_5;
  Integer _i_5;
  Integer _ncols_4;
  Integer _ld_b_4;
  Integer _kk_4;
  Integer _jj_4;
  Integer _ii_4;
  Integer _k_4;
  Integer _j_4;
  Integer _i_4;
  Integer _ncols_3;
  Integer _ld_b_3;
  Integer _kk_3;
  Integer _jj_3;
  Integer _ii_3;
  Integer _k_3;
  Integer _j_3;
  Integer _i_3;
  Integer _ncols_2;
  Integer _ld_b_2;
  Integer _kk_2;
  Integer _jj_2;
  Integer _ii_2;
  Integer _k_2;
  Integer _j_2;
  Integer _i_2;
  Integer _ncols_1;
  Integer _ld_b_1;
  Integer _kk_1;
  Integer _jj_1;
  Integer _ii_1;
  Integer _k_1;
  Integer _j_1;
  Integer _i_1;
  Integer _ncols;
  Integer _ld_b;
  Integer _kk;
  Integer _jj;
  Integer _ii;
  Integer _k;
  Integer _j;
  Integer _i;
  int *jdx_a;
  int *idx_a;
  Integer jlen;
  Integer ii;
  Integer nelem;
  void *buf_b;
  void *val_a;
  Integer thi_b [2];
  Integer tlo_b [2];
  Integer ld_b [2];
  Integer hi_b [2];
  Integer lo_b [2];
  Integer jhi_a;
  Integer jlo_a;
  Integer ihi_a;
  Integer ilo_a;
  void *jptr_a;
  void *iptr_a;
  Integer thi_c [2];
  Integer tlo_c [2];
  Integer ld_c [2];
  Integer hi_c [2];
  Integer lo_c [2];
  void *data_b;
  void *data_a;
  void *data_c;
  Integer *size;
  Integer *map;
  int64_t max_nnz;
  Integer *row_nnz;
  Integer max_nnz_b;
  Integer max_nnz_a;
  Integer ilen;
  Integer two;
  Integer g_c;
  Integer nblocks;
  Integer *count;
  Integer rowdim;
  Integer blocks [2];
  Integer gdims [2];
  Integer jlo;
  Integer jhi;
  Integer type;
  Integer longidx;
  Integer me;
  Integer nprocs;
  Integer nn;
  Integer n;
  Integer m;
  Integer l;
  Integer k;
  Integer j;
  Integer i;
  Integer jdim;
  Integer idim;
  Integer elemsize;
  int local_sync_end;
  int local_sync_begin;
  Integer hdl_c;
  Integer hdl_b;
  Integer hdl_a;
  Integer icnt;
  Integer lcnt;
  Integer in_stack_fffffffffffff8d8;
  char *in_stack_fffffffffffff8e0;
  Integer in_stack_fffffffffffff8e8;
  Integer *in_stack_fffffffffffff8f0;
  Integer in_stack_fffffffffffff8f8;
  Integer *in_stack_fffffffffffff900;
  Integer *in_stack_fffffffffffff908;
  Integer in_stack_fffffffffffff910;
  void *in_stack_fffffffffffff950;
  void *in_stack_fffffffffffff958;
  void *in_stack_fffffffffffff960;
  long in_stack_fffffffffffff968;
  Integer *in_stack_fffffffffffff970;
  Integer *local_688;
  long local_628;
  Integer *local_620;
  Integer *local_618;
  Integer in_stack_fffffffffffffa00;
  long local_5e8;
  Integer *local_5e0;
  Integer *local_5d8;
  long local_5a8;
  Integer *local_5a0;
  Integer *local_598;
  Integer in_stack_fffffffffffffa78;
  char *in_stack_fffffffffffffa80;
  Integer *in_stack_fffffffffffffa90;
  void *in_stack_fffffffffffffa98;
  Integer *in_stack_fffffffffffffaa0;
  Integer *in_stack_fffffffffffffaa8;
  long in_stack_fffffffffffffab0;
  long local_528;
  Integer *local_520;
  Integer *local_518;
  long local_4e8;
  Integer *local_4e0;
  Integer *local_4d8;
  long local_438;
  Integer *local_430;
  Integer *local_428;
  long local_3c8;
  Integer *local_3c0;
  Integer *local_3b8;
  long local_388;
  Integer *local_380;
  Integer *local_378;
  long local_348;
  Integer *in_stack_fffffffffffffcc0;
  Integer *in_stack_fffffffffffffcc8;
  Integer *in_stack_fffffffffffffcd0;
  Integer *in_stack_fffffffffffffcd8;
  long in_stack_fffffffffffffce0;
  long local_308;
  Integer *local_300;
  Integer *local_2f8;
  long local_2c8;
  Integer *local_2c0;
  Integer *local_2b8;
  long local_288;
  Integer *local_280;
  Integer *local_278;
  long local_240;
  long local_238;
  long local_230;
  Integer *local_228;
  Integer *local_220;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  Integer *local_1d0;
  long local_1c8;
  Integer in_stack_fffffffffffffe40;
  long local_1b8;
  Integer *local_1a8;
  Integer local_198;
  long local_180;
  Integer *local_178;
  Integer *local_170 [4];
  long local_150;
  void *local_148;
  undefined8 *local_140;
  undefined8 local_110;
  Integer local_108;
  long local_e8;
  long local_e0;
  Integer local_d8;
  Integer local_d0;
  Integer local_b8;
  ulong local_b0;
  Integer local_a8;
  Integer local_a0;
  long local_98;
  Integer local_90;
  long local_80;
  long local_68;
  Integer local_60;
  Integer local_58;
  Integer local_50;
  int local_48;
  int local_44;
  long local_40;
  long local_38;
  long local_30;
  long local_18;
  long local_8;
  
  local_30 = in_RDI + 1000;
  local_38 = in_RSI + 1000;
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_a0 = pnga_pgroup_nnodes(SPA[local_30].grp);
  local_a8 = pnga_pgroup_nodeid(SPA[local_30].grp);
  iVar9 = _ga_sync_begin;
  local_110 = 2;
  local_44 = _ga_sync_begin;
  local_48 = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar9 != 0) {
    pnga_pgroup_sync((Integer)in_stack_fffffffffffff8e0);
  }
  if (SPA[local_30].type != (long)GA[local_38].type) {
    pnga_error(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  }
  local_b8 = SPA[local_30].type;
  if (SPA[local_30].grp != (long)GA[local_38].p_handle) {
    pnga_error(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  }
  if (GA[local_38].ndim != 2) {
    pnga_error(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  }
  if (((local_18 != 0) && (SPA[local_30].jdim != GA[local_38].dims[1])) ||
     ((local_18 == 0 && (SPA[local_30].jdim != GA[local_38].dims[0])))) {
    pnga_error(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  }
  local_b0 = (ulong)(SPA[local_30].idx_size == 8);
  local_50 = SPA[local_30].size;
  local_58 = SPA[local_30].idim;
  if (local_18 == 0) {
    local_60 = GA[local_38].dims[1];
  }
  else {
    local_60 = GA[local_38].dims[0];
  }
  pnga_mask_sync((long)local_44,(long)local_48);
  local_108 = pnga_create_handle();
  local_40 = local_108 + 1000;
  if (local_18 == 0) {
    local_d8 = local_58;
    local_d0 = local_60;
  }
  else {
    local_d8 = local_60;
    local_d0 = local_58;
  }
  pnga_set_data((Integer)in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
                in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
  local_140 = (undefined8 *)malloc((local_a0 + 1) * 8);
  local_148 = malloc(local_a0 << 3);
  for (local_68 = 0; local_68 < local_a0; local_68 = local_68 + 1) {
    *(undefined8 *)((long)local_148 + local_68 * 8) = 0;
  }
  *(Integer *)((long)local_148 + local_a8 * 8) = (SPA[local_30].ihi - SPA[local_30].ilo) + 1;
  pnga_pgroup_gop((Integer)in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
                  in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
  if (local_18 == 0) {
    *local_140 = 1;
    for (local_68 = 1; local_68 < local_a0; local_68 = local_68 + 1) {
      local_140[local_68] =
           local_140[local_68 + -1] + *(long *)((long)local_148 + (local_68 + -1) * 8);
    }
    local_140[local_a0] = 1;
    local_e8 = local_a0;
    local_e0 = 1;
  }
  else {
    *local_140 = 1;
    local_140[1] = 1;
    for (local_68 = 1; local_68 < local_a0; local_68 = local_68 + 1) {
      local_140[local_68 + 1] =
           local_140[local_68] + *(long *)((long)local_148 + (local_68 + -1) * 8);
    }
    local_e8 = 1;
    local_e0 = local_a0;
  }
  pnga_set_irreg_distr
            (in_stack_fffffffffffff910,in_stack_fffffffffffff908,in_stack_fffffffffffff900);
  pnga_set_pgroup((Integer)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
  pnga_mask_sync((long)local_44,(long)local_48);
  lVar12 = pnga_allocate(in_stack_fffffffffffffe40);
  if (lVar12 == 0) {
    pnga_error(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  }
  pnga_mask_sync((long)local_44,(long)local_48);
  pnga_zero(in_stack_fffffffffffffa00);
  for (local_80 = 0; local_80 < local_a0; local_80 = local_80 + 1) {
    local_178 = (Integer *)(SPA[local_30].ilo + 1);
    lVar11 = SPA[local_30].ihi;
    pnga_sprs_array_column_distribution(local_8,local_80,(Integer *)local_170,&local_180);
    local_170[0] = (Integer *)((long)local_170[0] + 1);
    local_180 = local_180 + 1;
    local_1b8 = local_180;
    local_1a8 = local_170[0];
    if (local_18 == 0) {
      local_1a8 = local_178;
      local_1b8 = lVar11 + 1;
    }
    for (local_98 = 0; local_98 < SPA[local_30].nblocks; local_98 = local_98 + 1) {
      local_90 = SPA[local_30].blkidx[local_98];
      if (local_18 == 0) {
        local_198 = (local_1b8 - (long)local_1a8) + 1;
      }
      else {
        local_198 = local_60;
      }
      pnga_access_ptr(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                      in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
      local_1d0 = (Integer *)((long)local_178 + -1);
      local_1d8 = lVar11;
      pnga_sprs_array_column_distribution(local_8,local_90,&local_1e0,&local_1e8);
      pnga_sprs_array_access_col_block
                ((Integer)in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                 in_stack_fffffffffffff960,in_stack_fffffffffffff958,in_stack_fffffffffffff950);
      if (local_18 == 0) {
        local_220 = local_170[0];
        local_230 = local_180;
        local_238 = local_1e8 + 1;
        local_228 = (Integer *)(local_1e0 + 1);
      }
      else {
        local_228 = local_170[0];
        local_238 = local_180;
        local_230 = local_1e8 + 1;
        local_220 = (Integer *)(local_1e0 + 1);
      }
      __ptr = malloc(((local_238 - (long)local_228) + 1) * ((local_230 - (long)local_220) + 1) *
                     SPA[local_30].size);
      pnga_get(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
               in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
      if (SPA[local_30].idx_size == 4) {
        if (local_b8 == 0x3e9) {
          lVar13 = (local_238 - (long)local_228) + 1;
          for (local_278 = local_1d0; (long)local_278 <= local_1d8;
              local_278 = (Integer *)((long)local_278 + 1)) {
            lVar14 = (long)local_278 - (long)local_1d0;
            iVar9 = *(int *)(in_stack_fffffffffffffe40 + 4 + lVar14 * 4);
            iVar10 = *(int *)(in_stack_fffffffffffffe40 + lVar14 * 4);
            for (local_288 = 0; local_288 < iVar9 - iVar10; local_288 = local_288 + 1) {
              lVar15 = *(int *)(local_1c8 +
                               (*(int *)(in_stack_fffffffffffffe40 + lVar14 * 4) + local_288) * 4) -
                       local_1e0;
              if (local_18 == 0) {
                for (local_280 = local_228; (long)local_280 <= local_238;
                    local_280 = (Integer *)((long)local_280 + 1)) {
                  lVar17 = (long)local_278 +
                           (local_198 * ((long)local_280 - (long)local_228) - (long)local_1d0);
                  *(int *)(local_150 + lVar17 * 4) =
                       *(int *)(local_240 +
                               (*(int *)(in_stack_fffffffffffffe40 + lVar14 * 4) + local_288) * 4) *
                       *(int *)((long)__ptr +
                               (lVar15 + ((long)local_280 - (long)local_228) * lVar13) * 4) +
                       *(int *)(local_150 + lVar17 * 4);
                }
              }
              else {
                for (local_280 = local_228; (long)local_280 <= local_238;
                    local_280 = (Integer *)((long)local_280 + 1)) {
                  lVar17 = (long)local_280 +
                           (((long)local_278 - (long)local_1d0) * local_198 - (long)local_228);
                  *(int *)(local_150 + lVar17 * 4) =
                       *(int *)(local_240 +
                               (*(int *)(in_stack_fffffffffffffe40 + lVar14 * 4) + local_288) * 4) *
                       *(int *)((long)__ptr +
                               ((long)local_280 + (lVar15 * lVar13 - (long)local_228)) * 4) +
                       *(int *)(local_150 + lVar17 * 4);
                }
              }
            }
          }
        }
        else if (local_b8 == 0x3ea) {
          lVar13 = (local_238 - (long)local_228) + 1;
          for (local_2b8 = local_1d0; (long)local_2b8 <= local_1d8;
              local_2b8 = (Integer *)((long)local_2b8 + 1)) {
            lVar14 = (long)local_2b8 - (long)local_1d0;
            iVar9 = *(int *)(in_stack_fffffffffffffe40 + 4 + lVar14 * 4);
            iVar10 = *(int *)(in_stack_fffffffffffffe40 + lVar14 * 4);
            for (local_2c8 = 0; local_2c8 < iVar9 - iVar10; local_2c8 = local_2c8 + 1) {
              lVar15 = *(int *)(local_1c8 +
                               (*(int *)(in_stack_fffffffffffffe40 + lVar14 * 4) + local_2c8) * 4) -
                       local_1e0;
              if (local_18 == 0) {
                for (local_2c0 = local_228; (long)local_2c0 <= local_238;
                    local_2c0 = (Integer *)((long)local_2c0 + 1)) {
                  lVar17 = (long)local_2b8 +
                           (local_198 * ((long)local_2c0 - (long)local_228) - (long)local_1d0);
                  *(long *)(local_150 + lVar17 * 8) =
                       *(long *)(local_240 +
                                (*(int *)(in_stack_fffffffffffffe40 + lVar14 * 4) + local_2c8) * 8)
                       * *(long *)((long)__ptr +
                                  (lVar15 + ((long)local_2c0 - (long)local_228) * lVar13) * 8) +
                       *(long *)(local_150 + lVar17 * 8);
                }
              }
              else {
                for (local_2c0 = local_228; (long)local_2c0 <= local_238;
                    local_2c0 = (Integer *)((long)local_2c0 + 1)) {
                  lVar17 = (long)local_2c0 +
                           (((long)local_2b8 - (long)local_1d0) * local_198 - (long)local_228);
                  *(long *)(local_150 + lVar17 * 8) =
                       *(long *)(local_240 +
                                (*(int *)(in_stack_fffffffffffffe40 + lVar14 * 4) + local_2c8) * 8)
                       * *(long *)((long)__ptr +
                                  ((long)local_2c0 + (lVar15 * lVar13 - (long)local_228)) * 8) +
                       *(long *)(local_150 + lVar17 * 8);
                }
              }
            }
          }
        }
        else if (local_b8 == 0x3f8) {
          in_stack_fffffffffffffcd8 = (Integer *)((local_238 - (long)local_228) + 1);
          for (local_2f8 = local_1d0; (long)local_2f8 <= local_1d8;
              local_2f8 = (Integer *)((long)local_2f8 + 1)) {
            lVar13 = (long)local_2f8 - (long)local_1d0;
            in_stack_fffffffffffffcd0 =
                 (Integer *)
                 (long)(*(int *)(in_stack_fffffffffffffe40 + 4 + lVar13 * 4) -
                       *(int *)(in_stack_fffffffffffffe40 + lVar13 * 4));
            for (local_308 = 0; local_308 < (long)in_stack_fffffffffffffcd0;
                local_308 = local_308 + 1) {
              in_stack_fffffffffffffce0 =
                   *(int *)(local_1c8 +
                           (*(int *)(in_stack_fffffffffffffe40 + lVar13 * 4) + local_308) * 4) -
                   local_1e0;
              if (local_18 == 0) {
                for (local_300 = local_228; (long)local_300 <= local_238;
                    local_300 = (Integer *)((long)local_300 + 1)) {
                  lVar14 = (long)local_2f8 +
                           (local_198 * ((long)local_300 - (long)local_228) - (long)local_1d0);
                  *(long *)(local_150 + lVar14 * 8) =
                       *(long *)(local_240 +
                                (*(int *)(in_stack_fffffffffffffe40 + lVar13 * 4) + local_308) * 8)
                       * *(long *)((long)__ptr +
                                  (in_stack_fffffffffffffce0 +
                                  ((long)local_300 - (long)local_228) *
                                  (long)in_stack_fffffffffffffcd8) * 8) +
                       *(long *)(local_150 + lVar14 * 8);
                }
              }
              else {
                for (local_300 = local_228; (long)local_300 <= local_238;
                    local_300 = (Integer *)((long)local_300 + 1)) {
                  lVar14 = (long)local_300 +
                           (((long)local_2f8 - (long)local_1d0) * local_198 - (long)local_228);
                  *(long *)(local_150 + lVar14 * 8) =
                       *(long *)(local_240 +
                                (*(int *)(in_stack_fffffffffffffe40 + lVar13 * 4) + local_308) * 8)
                       * *(long *)((long)__ptr +
                                  ((long)local_300 +
                                  (in_stack_fffffffffffffce0 * (long)in_stack_fffffffffffffcd8 -
                                  (long)local_228)) * 8) + *(long *)(local_150 + lVar14 * 8);
                }
              }
            }
          }
        }
        else if (local_b8 == 0x3eb) {
          lVar13 = (local_238 - (long)local_228) + 1;
          for (in_stack_fffffffffffffcc8 = local_1d0; (long)in_stack_fffffffffffffcc8 <= local_1d8;
              in_stack_fffffffffffffcc8 = (Integer *)((long)in_stack_fffffffffffffcc8 + 1)) {
            lVar14 = (long)in_stack_fffffffffffffcc8 - (long)local_1d0;
            iVar9 = *(int *)(in_stack_fffffffffffffe40 + 4 + lVar14 * 4);
            iVar10 = *(int *)(in_stack_fffffffffffffe40 + lVar14 * 4);
            for (local_348 = 0; local_348 < iVar9 - iVar10; local_348 = local_348 + 1) {
              lVar15 = *(int *)(local_1c8 +
                               (*(int *)(in_stack_fffffffffffffe40 + lVar14 * 4) + local_348) * 4) -
                       local_1e0;
              in_stack_fffffffffffffcc0 = local_228;
              if (local_18 == 0) {
                for (; (long)in_stack_fffffffffffffcc0 <= local_238;
                    in_stack_fffffffffffffcc0 = (Integer *)((long)in_stack_fffffffffffffcc0 + 1)) {
                  lVar17 = (long)in_stack_fffffffffffffcc8 +
                           (local_198 * ((long)in_stack_fffffffffffffcc0 - (long)local_228) -
                           (long)local_1d0);
                  *(float *)(local_150 + lVar17 * 4) =
                       *(float *)(local_240 +
                                 (*(int *)(in_stack_fffffffffffffe40 + lVar14 * 4) + local_348) * 4)
                       * *(float *)((long)__ptr +
                                   (lVar15 + ((long)in_stack_fffffffffffffcc0 - (long)local_228) *
                                             lVar13) * 4) + *(float *)(local_150 + lVar17 * 4);
                }
              }
              else {
                for (; (long)in_stack_fffffffffffffcc0 <= local_238;
                    in_stack_fffffffffffffcc0 = (Integer *)((long)in_stack_fffffffffffffcc0 + 1)) {
                  lVar17 = (long)in_stack_fffffffffffffcc0 +
                           (((long)in_stack_fffffffffffffcc8 - (long)local_1d0) * local_198 -
                           (long)local_228);
                  *(float *)(local_150 + lVar17 * 4) =
                       *(float *)(local_240 +
                                 (*(int *)(in_stack_fffffffffffffe40 + lVar14 * 4) + local_348) * 4)
                       * *(float *)((long)__ptr +
                                   ((long)in_stack_fffffffffffffcc0 +
                                   (lVar15 * lVar13 - (long)local_228)) * 4) +
                       *(float *)(local_150 + lVar17 * 4);
                }
              }
            }
          }
        }
        else if (local_b8 == 0x3ec) {
          lVar13 = (local_238 - (long)local_228) + 1;
          for (local_378 = local_1d0; (long)local_378 <= local_1d8;
              local_378 = (Integer *)((long)local_378 + 1)) {
            lVar14 = (long)local_378 - (long)local_1d0;
            iVar9 = *(int *)(in_stack_fffffffffffffe40 + 4 + lVar14 * 4);
            iVar10 = *(int *)(in_stack_fffffffffffffe40 + lVar14 * 4);
            for (local_388 = 0; local_388 < iVar9 - iVar10; local_388 = local_388 + 1) {
              lVar15 = *(int *)(local_1c8 +
                               (*(int *)(in_stack_fffffffffffffe40 + lVar14 * 4) + local_388) * 4) -
                       local_1e0;
              if (local_18 == 0) {
                for (local_380 = local_228; (long)local_380 <= local_238;
                    local_380 = (Integer *)((long)local_380 + 1)) {
                  lVar17 = (long)local_378 +
                           (local_198 * ((long)local_380 - (long)local_228) - (long)local_1d0);
                  *(double *)(local_150 + lVar17 * 8) =
                       *(double *)
                        (local_240 +
                        (*(int *)(in_stack_fffffffffffffe40 + lVar14 * 4) + local_388) * 8) *
                       *(double *)
                        ((long)__ptr + (lVar15 + ((long)local_380 - (long)local_228) * lVar13) * 8)
                       + *(double *)(local_150 + lVar17 * 8);
                }
              }
              else {
                for (local_380 = local_228; (long)local_380 <= local_238;
                    local_380 = (Integer *)((long)local_380 + 1)) {
                  lVar17 = (long)local_380 +
                           (((long)local_378 - (long)local_1d0) * local_198 - (long)local_228);
                  *(double *)(local_150 + lVar17 * 8) =
                       *(double *)
                        (local_240 +
                        (*(int *)(in_stack_fffffffffffffe40 + lVar14 * 4) + local_388) * 8) *
                       *(double *)
                        ((long)__ptr + ((long)local_380 + (lVar15 * lVar13 - (long)local_228)) * 8)
                       + *(double *)(local_150 + lVar17 * 8);
                }
              }
            }
          }
        }
        else if (local_b8 == 0x3ee) {
          lVar13 = (local_238 - (long)local_228) + 1;
          for (local_3b8 = local_1d0; (long)local_3b8 <= local_1d8;
              local_3b8 = (Integer *)((long)local_3b8 + 1)) {
            lVar14 = (long)local_3b8 - (long)local_1d0;
            iVar9 = *(int *)(in_stack_fffffffffffffe40 + 4 + lVar14 * 4);
            iVar10 = *(int *)(in_stack_fffffffffffffe40 + lVar14 * 4);
            for (local_3c8 = 0; local_3c8 < iVar9 - iVar10; local_3c8 = local_3c8 + 1) {
              lVar15 = *(int *)(local_1c8 +
                               (*(int *)(in_stack_fffffffffffffe40 + lVar14 * 4) + local_3c8) * 4) -
                       local_1e0;
              if (local_18 == 0) {
                for (local_3c0 = local_228; (long)local_3c0 <= local_238;
                    local_3c0 = (Integer *)((long)local_3c0 + 1)) {
                  fVar1 = *(float *)(local_240 +
                                    (*(int *)(in_stack_fffffffffffffe40 + lVar14 * 4) + local_3c8) *
                                    8);
                  fVar2 = *(float *)(local_240 + 4 +
                                    (*(int *)(in_stack_fffffffffffffe40 + lVar14 * 4) + local_3c8) *
                                    8);
                  fVar3 = *(float *)((long)__ptr +
                                    (lVar15 + ((long)local_3c0 - (long)local_228) * lVar13) * 8);
                  fVar4 = *(float *)((long)__ptr +
                                    (lVar15 + ((long)local_3c0 - (long)local_228) * lVar13) * 8 + 4)
                  ;
                  lVar17 = (long)local_3b8 +
                           (((long)local_3c0 - (long)local_228) * local_198 - (long)local_1d0);
                  *(float *)(local_150 + lVar17 * 8) =
                       fVar1 * fVar3 + -(fVar2 * fVar4) + *(float *)(local_150 + lVar17 * 8);
                  lVar17 = (long)local_3b8 +
                           (((long)local_3c0 - (long)local_228) * local_198 - (long)local_1d0);
                  *(float *)(local_150 + 4 + lVar17 * 8) =
                       fVar2 * fVar3 + fVar1 * fVar4 + *(float *)(local_150 + 4 + lVar17 * 8);
                }
              }
              else {
                for (local_3c0 = local_228; (long)local_3c0 <= local_238;
                    local_3c0 = (Integer *)((long)local_3c0 + 1)) {
                  fVar1 = *(float *)(local_240 +
                                    (*(int *)(in_stack_fffffffffffffe40 + lVar14 * 4) + local_3c8) *
                                    8);
                  fVar2 = *(float *)(local_240 + 4 +
                                    (*(int *)(in_stack_fffffffffffffe40 + lVar14 * 4) + local_3c8) *
                                    8);
                  fVar3 = *(float *)((long)__ptr +
                                    ((long)local_3c0 + (lVar15 * lVar13 - (long)local_228)) * 8);
                  fVar4 = *(float *)((long)__ptr +
                                    ((long)local_3c0 + (lVar15 * lVar13 - (long)local_228)) * 8 + 4)
                  ;
                  lVar17 = (long)local_3c0 +
                           (((long)local_3b8 - (long)local_1d0) * local_198 - (long)local_228);
                  *(float *)(local_150 + lVar17 * 8) =
                       fVar1 * fVar3 + -(fVar2 * fVar4) + *(float *)(local_150 + lVar17 * 8);
                  lVar17 = (long)local_3c0 +
                           (((long)local_3b8 - (long)local_1d0) * local_198 - (long)local_228);
                  *(float *)(local_150 + 4 + lVar17 * 8) =
                       fVar2 * fVar3 + fVar1 * fVar4 + *(float *)(local_150 + 4 + lVar17 * 8);
                }
              }
            }
          }
        }
        else if (local_b8 == 0x3ef) {
          lVar13 = (local_238 - (long)local_228) + 1;
          for (local_428 = local_1d0; (long)local_428 <= local_1d8;
              local_428 = (Integer *)((long)local_428 + 1)) {
            lVar14 = (long)local_428 - (long)local_1d0;
            iVar9 = *(int *)(in_stack_fffffffffffffe40 + 4 + lVar14 * 4);
            iVar10 = *(int *)(in_stack_fffffffffffffe40 + lVar14 * 4);
            for (local_438 = 0; local_438 < iVar9 - iVar10; local_438 = local_438 + 1) {
              lVar15 = *(int *)(local_1c8 +
                               (*(int *)(in_stack_fffffffffffffe40 + lVar14 * 4) + local_438) * 4) -
                       local_1e0;
              if (local_18 == 0) {
                for (local_430 = local_228; (long)local_430 <= local_238;
                    local_430 = (Integer *)((long)local_430 + 1)) {
                  dVar5 = *(double *)
                           (local_240 +
                           (*(int *)(in_stack_fffffffffffffe40 + lVar14 * 4) + local_438) * 0x10);
                  dVar6 = *(double *)
                           (local_240 + 8 +
                           (*(int *)(in_stack_fffffffffffffe40 + lVar14 * 4) + local_438) * 0x10);
                  dVar7 = *(double *)
                           ((long)__ptr +
                           (lVar15 + ((long)local_430 - (long)local_228) * lVar13) * 0x10);
                  dVar8 = *(double *)
                           ((long)__ptr +
                           (lVar15 + ((long)local_430 - (long)local_228) * lVar13) * 0x10 + 8);
                  lVar17 = (long)local_428 +
                           (((long)local_430 - (long)local_228) * local_198 - (long)local_1d0);
                  *(double *)(local_150 + lVar17 * 0x10) =
                       dVar5 * dVar7 + -(dVar6 * dVar8) + *(double *)(local_150 + lVar17 * 0x10);
                  lVar17 = (long)local_428 +
                           (((long)local_430 - (long)local_228) * local_198 - (long)local_1d0);
                  *(double *)(local_150 + 8 + lVar17 * 0x10) =
                       dVar6 * dVar7 + dVar5 * dVar8 + *(double *)(local_150 + 8 + lVar17 * 0x10);
                }
              }
              else {
                for (local_430 = local_228; (long)local_430 <= local_238;
                    local_430 = (Integer *)((long)local_430 + 1)) {
                  dVar5 = *(double *)
                           (local_240 +
                           (*(int *)(in_stack_fffffffffffffe40 + lVar14 * 4) + local_438) * 0x10);
                  dVar6 = *(double *)
                           (local_240 + 8 +
                           (*(int *)(in_stack_fffffffffffffe40 + lVar14 * 4) + local_438) * 0x10);
                  dVar7 = *(double *)
                           ((long)__ptr +
                           ((long)local_430 + (lVar15 * lVar13 - (long)local_228)) * 0x10);
                  dVar8 = *(double *)
                           ((long)__ptr +
                           ((long)local_430 + (lVar15 * lVar13 - (long)local_228)) * 0x10 + 8);
                  lVar17 = (long)local_430 +
                           (((long)local_428 - (long)local_1d0) * local_198 - (long)local_228);
                  *(double *)(local_150 + lVar17 * 0x10) =
                       dVar5 * dVar7 + -(dVar6 * dVar8) + *(double *)(local_150 + lVar17 * 0x10);
                  lVar17 = (long)local_430 +
                           (((long)local_428 - (long)local_1d0) * local_198 - (long)local_228);
                  *(double *)(local_150 + 8 + lVar17 * 0x10) =
                       dVar6 * dVar7 + dVar5 * dVar8 + *(double *)(local_150 + 8 + lVar17 * 0x10);
                }
              }
            }
          }
        }
      }
      else if (local_b8 == 0x3e9) {
        lVar13 = (local_238 - (long)local_228) + 1;
        for (local_4d8 = local_1d0; (long)local_4d8 <= local_1d8;
            local_4d8 = (Integer *)((long)local_4d8 + 1)) {
          lVar17 = (long)local_4d8 - (long)local_1d0;
          lVar14 = *(long *)(in_stack_fffffffffffffe40 + 8 + lVar17 * 8);
          lVar15 = *(long *)(in_stack_fffffffffffffe40 + lVar17 * 8);
          for (local_4e8 = 0; local_4e8 < lVar14 - lVar15; local_4e8 = local_4e8 + 1) {
            lVar16 = *(long *)(local_1c8 +
                              (*(long *)(in_stack_fffffffffffffe40 + lVar17 * 8) + local_4e8) * 8) -
                     local_1e0;
            if (local_18 == 0) {
              for (local_4e0 = local_228; (long)local_4e0 <= local_238;
                  local_4e0 = (Integer *)((long)local_4e0 + 1)) {
                lVar18 = (long)local_4d8 +
                         (local_198 * ((long)local_4e0 - (long)local_228) - (long)local_1d0);
                *(int *)(local_150 + lVar18 * 4) =
                     *(int *)(local_240 +
                             (*(long *)(in_stack_fffffffffffffe40 + lVar17 * 8) + local_4e8) * 4) *
                     *(int *)((long)__ptr +
                             (lVar16 + ((long)local_4e0 - (long)local_228) * lVar13) * 4) +
                     *(int *)(local_150 + lVar18 * 4);
              }
            }
            else {
              for (local_4e0 = local_228; (long)local_4e0 <= local_238;
                  local_4e0 = (Integer *)((long)local_4e0 + 1)) {
                lVar18 = (long)local_4e0 +
                         (((long)local_4d8 - (long)local_1d0) * local_198 - (long)local_228);
                *(int *)(local_150 + lVar18 * 4) =
                     *(int *)(local_240 +
                             (*(long *)(in_stack_fffffffffffffe40 + lVar17 * 8) + local_4e8) * 4) *
                     *(int *)((long)__ptr +
                             ((long)local_4e0 + (lVar16 * lVar13 - (long)local_228)) * 4) +
                     *(int *)(local_150 + lVar18 * 4);
              }
            }
          }
        }
      }
      else if (local_b8 == 0x3ea) {
        lVar13 = (local_238 - (long)local_228) + 1;
        for (local_518 = local_1d0; (long)local_518 <= local_1d8;
            local_518 = (Integer *)((long)local_518 + 1)) {
          lVar14 = (long)local_518 - (long)local_1d0;
          in_stack_fffffffffffffab0 =
               *(long *)(in_stack_fffffffffffffe40 + 8 + lVar14 * 8) -
               *(long *)(in_stack_fffffffffffffe40 + lVar14 * 8);
          for (local_528 = 0; local_528 < in_stack_fffffffffffffab0; local_528 = local_528 + 1) {
            lVar15 = *(long *)(local_1c8 +
                              (*(long *)(in_stack_fffffffffffffe40 + lVar14 * 8) + local_528) * 8) -
                     local_1e0;
            if (local_18 == 0) {
              for (local_520 = local_228; (long)local_520 <= local_238;
                  local_520 = (Integer *)((long)local_520 + 1)) {
                lVar17 = (long)local_518 +
                         (local_198 * ((long)local_520 - (long)local_228) - (long)local_1d0);
                *(long *)(local_150 + lVar17 * 8) =
                     *(long *)(local_240 +
                              (*(long *)(in_stack_fffffffffffffe40 + lVar14 * 8) + local_528) * 8) *
                     *(long *)((long)__ptr +
                              (lVar15 + ((long)local_520 - (long)local_228) * lVar13) * 8) +
                     *(long *)(local_150 + lVar17 * 8);
              }
            }
            else {
              for (local_520 = local_228; (long)local_520 <= local_238;
                  local_520 = (Integer *)((long)local_520 + 1)) {
                lVar17 = (long)local_520 +
                         (((long)local_518 - (long)local_1d0) * local_198 - (long)local_228);
                *(long *)(local_150 + lVar17 * 8) =
                     *(long *)(local_240 +
                              (*(long *)(in_stack_fffffffffffffe40 + lVar14 * 8) + local_528) * 8) *
                     *(long *)((long)__ptr +
                              ((long)local_520 + (lVar15 * lVar13 - (long)local_228)) * 8) +
                     *(long *)(local_150 + lVar17 * 8);
              }
            }
          }
        }
      }
      else if (local_b8 == 0x3f8) {
        lVar13 = (local_238 - (long)local_228) + 1;
        for (in_stack_fffffffffffffaa8 = local_1d0; (long)in_stack_fffffffffffffaa8 <= local_1d8;
            in_stack_fffffffffffffaa8 = (Integer *)((long)in_stack_fffffffffffffaa8 + 1)) {
          in_stack_fffffffffffffa90 = (Integer *)((long)in_stack_fffffffffffffaa8 - (long)local_1d0)
          ;
          lVar14 = *(long *)(in_stack_fffffffffffffe40 + 8 + (long)in_stack_fffffffffffffa90 * 8);
          lVar15 = *(long *)(in_stack_fffffffffffffe40 + (long)in_stack_fffffffffffffa90 * 8);
          for (in_stack_fffffffffffffa98 = (void *)0x0;
              (long)in_stack_fffffffffffffa98 < lVar14 - lVar15;
              in_stack_fffffffffffffa98 = (void *)((long)in_stack_fffffffffffffa98 + 1)) {
            lVar17 = *(long *)(local_1c8 +
                              (*(long *)(in_stack_fffffffffffffe40 +
                                        (long)in_stack_fffffffffffffa90 * 8) +
                              (long)in_stack_fffffffffffffa98) * 8) - local_1e0;
            in_stack_fffffffffffffaa0 = local_228;
            if (local_18 == 0) {
              for (; (long)in_stack_fffffffffffffaa0 <= local_238;
                  in_stack_fffffffffffffaa0 = (Integer *)((long)in_stack_fffffffffffffaa0 + 1)) {
                lVar16 = (long)in_stack_fffffffffffffaa8 +
                         (local_198 * ((long)in_stack_fffffffffffffaa0 - (long)local_228) -
                         (long)local_1d0);
                *(long *)(local_150 + lVar16 * 8) =
                     *(long *)(local_240 +
                              (*(long *)(in_stack_fffffffffffffe40 +
                                        (long)in_stack_fffffffffffffa90 * 8) +
                              (long)in_stack_fffffffffffffa98) * 8) *
                     *(long *)((long)__ptr +
                              (lVar17 + ((long)in_stack_fffffffffffffaa0 - (long)local_228) * lVar13
                              ) * 8) + *(long *)(local_150 + lVar16 * 8);
              }
            }
            else {
              for (; (long)in_stack_fffffffffffffaa0 <= local_238;
                  in_stack_fffffffffffffaa0 = (Integer *)((long)in_stack_fffffffffffffaa0 + 1)) {
                lVar16 = (long)in_stack_fffffffffffffaa0 +
                         (((long)in_stack_fffffffffffffaa8 - (long)local_1d0) * local_198 -
                         (long)local_228);
                *(long *)(local_150 + lVar16 * 8) =
                     *(long *)(local_240 +
                              (*(long *)(in_stack_fffffffffffffe40 +
                                        (long)in_stack_fffffffffffffa90 * 8) +
                              (long)in_stack_fffffffffffffa98) * 8) *
                     *(long *)((long)__ptr +
                              ((long)in_stack_fffffffffffffaa0 + (lVar17 * lVar13 - (long)local_228)
                              ) * 8) + *(long *)(local_150 + lVar16 * 8);
              }
            }
          }
        }
      }
      else if (local_b8 == 0x3eb) {
        lVar13 = (local_238 - (long)local_228) + 1;
        for (local_598 = local_1d0; (long)local_598 <= local_1d8;
            local_598 = (Integer *)((long)local_598 + 1)) {
          lVar17 = (long)local_598 - (long)local_1d0;
          lVar14 = *(long *)(in_stack_fffffffffffffe40 + 8 + lVar17 * 8);
          lVar15 = *(long *)(in_stack_fffffffffffffe40 + lVar17 * 8);
          for (local_5a8 = 0; local_5a8 < lVar14 - lVar15; local_5a8 = local_5a8 + 1) {
            lVar16 = *(long *)(local_1c8 +
                              (*(long *)(in_stack_fffffffffffffe40 + lVar17 * 8) + local_5a8) * 8) -
                     local_1e0;
            if (local_18 == 0) {
              for (local_5a0 = local_228; (long)local_5a0 <= local_238;
                  local_5a0 = (Integer *)((long)local_5a0 + 1)) {
                lVar18 = (long)local_598 +
                         (local_198 * ((long)local_5a0 - (long)local_228) - (long)local_1d0);
                *(float *)(local_150 + lVar18 * 4) =
                     *(float *)(local_240 +
                               (*(long *)(in_stack_fffffffffffffe40 + lVar17 * 8) + local_5a8) * 4)
                     * *(float *)((long)__ptr +
                                 (lVar16 + ((long)local_5a0 - (long)local_228) * lVar13) * 4) +
                     *(float *)(local_150 + lVar18 * 4);
              }
            }
            else {
              for (local_5a0 = local_228; (long)local_5a0 <= local_238;
                  local_5a0 = (Integer *)((long)local_5a0 + 1)) {
                lVar18 = (long)local_5a0 +
                         (((long)local_598 - (long)local_1d0) * local_198 - (long)local_228);
                *(float *)(local_150 + lVar18 * 4) =
                     *(float *)(local_240 +
                               (*(long *)(in_stack_fffffffffffffe40 + lVar17 * 8) + local_5a8) * 4)
                     * *(float *)((long)__ptr +
                                 ((long)local_5a0 + (lVar16 * lVar13 - (long)local_228)) * 4) +
                     *(float *)(local_150 + lVar18 * 4);
              }
            }
          }
        }
      }
      else if (local_b8 == 0x3ec) {
        lVar13 = (local_238 - (long)local_228) + 1;
        for (local_5d8 = local_1d0; (long)local_5d8 <= local_1d8;
            local_5d8 = (Integer *)((long)local_5d8 + 1)) {
          lVar17 = (long)local_5d8 - (long)local_1d0;
          lVar14 = *(long *)(in_stack_fffffffffffffe40 + 8 + lVar17 * 8);
          lVar15 = *(long *)(in_stack_fffffffffffffe40 + lVar17 * 8);
          for (local_5e8 = 0; local_5e8 < lVar14 - lVar15; local_5e8 = local_5e8 + 1) {
            lVar16 = *(long *)(local_1c8 +
                              (*(long *)(in_stack_fffffffffffffe40 + lVar17 * 8) + local_5e8) * 8) -
                     local_1e0;
            if (local_18 == 0) {
              for (local_5e0 = local_228; (long)local_5e0 <= local_238;
                  local_5e0 = (Integer *)((long)local_5e0 + 1)) {
                lVar18 = (long)local_5d8 +
                         (local_198 * ((long)local_5e0 - (long)local_228) - (long)local_1d0);
                *(double *)(local_150 + lVar18 * 8) =
                     *(double *)
                      (local_240 +
                      (*(long *)(in_stack_fffffffffffffe40 + lVar17 * 8) + local_5e8) * 8) *
                     *(double *)
                      ((long)__ptr + (lVar16 + ((long)local_5e0 - (long)local_228) * lVar13) * 8) +
                     *(double *)(local_150 + lVar18 * 8);
              }
            }
            else {
              for (local_5e0 = local_228; (long)local_5e0 <= local_238;
                  local_5e0 = (Integer *)((long)local_5e0 + 1)) {
                lVar18 = (long)local_5e0 +
                         (((long)local_5d8 - (long)local_1d0) * local_198 - (long)local_228);
                *(double *)(local_150 + lVar18 * 8) =
                     *(double *)
                      (local_240 +
                      (*(long *)(in_stack_fffffffffffffe40 + lVar17 * 8) + local_5e8) * 8) *
                     *(double *)
                      ((long)__ptr + ((long)local_5e0 + (lVar16 * lVar13 - (long)local_228)) * 8) +
                     *(double *)(local_150 + lVar18 * 8);
              }
            }
          }
        }
      }
      else if (local_b8 == 0x3ee) {
        lVar13 = (local_238 - (long)local_228) + 1;
        for (local_618 = local_1d0; (long)local_618 <= local_1d8;
            local_618 = (Integer *)((long)local_618 + 1)) {
          lVar17 = (long)local_618 - (long)local_1d0;
          lVar14 = *(long *)(in_stack_fffffffffffffe40 + 8 + lVar17 * 8);
          lVar15 = *(long *)(in_stack_fffffffffffffe40 + lVar17 * 8);
          for (local_628 = 0; local_628 < lVar14 - lVar15; local_628 = local_628 + 1) {
            lVar16 = *(long *)(local_1c8 +
                              (*(long *)(in_stack_fffffffffffffe40 + lVar17 * 8) + local_628) * 8) -
                     local_1e0;
            if (local_18 == 0) {
              for (local_620 = local_228; (long)local_620 <= local_238;
                  local_620 = (Integer *)((long)local_620 + 1)) {
                fVar1 = *(float *)(local_240 +
                                  (*(long *)(in_stack_fffffffffffffe40 + lVar17 * 8) + local_628) *
                                  8);
                fVar2 = *(float *)(local_240 + 4 +
                                  (*(long *)(in_stack_fffffffffffffe40 + lVar17 * 8) + local_628) *
                                  8);
                fVar3 = *(float *)((long)__ptr +
                                  (lVar16 + ((long)local_620 - (long)local_228) * lVar13) * 8);
                fVar4 = *(float *)((long)__ptr +
                                  (lVar16 + ((long)local_620 - (long)local_228) * lVar13) * 8 + 4);
                lVar18 = (long)local_618 +
                         (((long)local_620 - (long)local_228) * local_198 - (long)local_1d0);
                *(float *)(local_150 + lVar18 * 8) =
                     fVar1 * fVar3 + -(fVar2 * fVar4) + *(float *)(local_150 + lVar18 * 8);
                lVar18 = (long)local_618 +
                         (((long)local_620 - (long)local_228) * local_198 - (long)local_1d0);
                *(float *)(local_150 + 4 + lVar18 * 8) =
                     fVar2 * fVar3 + fVar1 * fVar4 + *(float *)(local_150 + 4 + lVar18 * 8);
              }
            }
            else {
              for (local_620 = local_228; (long)local_620 <= local_238;
                  local_620 = (Integer *)((long)local_620 + 1)) {
                fVar1 = *(float *)(local_240 +
                                  (*(long *)(in_stack_fffffffffffffe40 + lVar17 * 8) + local_628) *
                                  8);
                fVar2 = *(float *)(local_240 + 4 +
                                  (*(long *)(in_stack_fffffffffffffe40 + lVar17 * 8) + local_628) *
                                  8);
                fVar3 = *(float *)((long)__ptr +
                                  ((long)local_620 + (lVar16 * lVar13 - (long)local_228)) * 8);
                fVar4 = *(float *)((long)__ptr +
                                  ((long)local_620 + (lVar16 * lVar13 - (long)local_228)) * 8 + 4);
                lVar18 = (long)local_620 +
                         (((long)local_618 - (long)local_1d0) * local_198 - (long)local_228);
                *(float *)(local_150 + lVar18 * 8) =
                     fVar1 * fVar3 + -(fVar2 * fVar4) + *(float *)(local_150 + lVar18 * 8);
                lVar18 = (long)local_620 +
                         (((long)local_618 - (long)local_1d0) * local_198 - (long)local_228);
                *(float *)(local_150 + 4 + lVar18 * 8) =
                     fVar2 * fVar3 + fVar1 * fVar4 + *(float *)(local_150 + 4 + lVar18 * 8);
              }
            }
          }
        }
      }
      else if (local_b8 == 0x3ef) {
        lVar13 = (local_238 - (long)local_228) + 1;
        for (local_688 = local_1d0; (long)local_688 <= local_1d8;
            local_688 = (Integer *)((long)local_688 + 1)) {
          in_stack_fffffffffffff960 = (void *)((long)local_688 - (long)local_1d0);
          lVar14 = *(long *)(in_stack_fffffffffffffe40 + 8 + (long)in_stack_fffffffffffff960 * 8);
          lVar15 = *(long *)(in_stack_fffffffffffffe40 + (long)in_stack_fffffffffffff960 * 8);
          for (in_stack_fffffffffffff968 = 0; in_stack_fffffffffffff968 < lVar14 - lVar15;
              in_stack_fffffffffffff968 = in_stack_fffffffffffff968 + 1) {
            in_stack_fffffffffffff950 =
                 (void *)(*(long *)(local_1c8 +
                                   (*(long *)(in_stack_fffffffffffffe40 +
                                             (long)in_stack_fffffffffffff960 * 8) +
                                   in_stack_fffffffffffff968) * 8) - local_1e0);
            in_stack_fffffffffffff970 = local_228;
            if (local_18 == 0) {
              for (; (long)in_stack_fffffffffffff970 <= local_238;
                  in_stack_fffffffffffff970 = (Integer *)((long)in_stack_fffffffffffff970 + 1)) {
                dVar5 = *(double *)
                         (local_240 +
                         (*(long *)(in_stack_fffffffffffffe40 + (long)in_stack_fffffffffffff960 * 8)
                         + in_stack_fffffffffffff968) * 0x10);
                dVar6 = *(double *)
                         (local_240 + 8 +
                         (*(long *)(in_stack_fffffffffffffe40 + (long)in_stack_fffffffffffff960 * 8)
                         + in_stack_fffffffffffff968) * 0x10);
                dVar7 = *(double *)
                         ((long)__ptr +
                         (long)((long)in_stack_fffffffffffff950 +
                               ((long)in_stack_fffffffffffff970 - (long)local_228) * lVar13) * 0x10)
                ;
                dVar8 = *(double *)
                         ((long)__ptr +
                         (long)((long)in_stack_fffffffffffff950 +
                               ((long)in_stack_fffffffffffff970 - (long)local_228) * lVar13) * 0x10
                         + 8);
                lVar17 = (long)local_688 +
                         (((long)in_stack_fffffffffffff970 - (long)local_228) * local_198 -
                         (long)local_1d0);
                *(double *)(local_150 + lVar17 * 0x10) =
                     dVar5 * dVar7 + -(dVar6 * dVar8) + *(double *)(local_150 + lVar17 * 0x10);
                lVar17 = (long)local_688 +
                         (((long)in_stack_fffffffffffff970 - (long)local_228) * local_198 -
                         (long)local_1d0);
                *(double *)(local_150 + 8 + lVar17 * 0x10) =
                     dVar6 * dVar7 + dVar5 * dVar8 + *(double *)(local_150 + 8 + lVar17 * 0x10);
              }
            }
            else {
              for (; (long)in_stack_fffffffffffff970 <= local_238;
                  in_stack_fffffffffffff970 = (Integer *)((long)in_stack_fffffffffffff970 + 1)) {
                dVar5 = *(double *)
                         (local_240 +
                         (*(long *)(in_stack_fffffffffffffe40 + (long)in_stack_fffffffffffff960 * 8)
                         + in_stack_fffffffffffff968) * 0x10);
                dVar6 = *(double *)
                         (local_240 + 8 +
                         (*(long *)(in_stack_fffffffffffffe40 + (long)in_stack_fffffffffffff960 * 8)
                         + in_stack_fffffffffffff968) * 0x10);
                dVar7 = *(double *)
                         ((long)__ptr +
                         ((long)in_stack_fffffffffffff970 +
                         ((long)in_stack_fffffffffffff950 * lVar13 - (long)local_228)) * 0x10);
                dVar8 = *(double *)
                         ((long)__ptr +
                         ((long)in_stack_fffffffffffff970 +
                         ((long)in_stack_fffffffffffff950 * lVar13 - (long)local_228)) * 0x10 + 8);
                lVar17 = (long)in_stack_fffffffffffff970 +
                         (((long)local_688 - (long)local_1d0) * local_198 - (long)local_228);
                *(double *)(local_150 + lVar17 * 0x10) =
                     dVar5 * dVar7 + -(dVar6 * dVar8) + *(double *)(local_150 + lVar17 * 0x10);
                lVar17 = (long)in_stack_fffffffffffff970 +
                         (((long)local_688 - (long)local_1d0) * local_198 - (long)local_228);
                *(double *)(local_150 + 8 + lVar17 * 0x10) =
                     dVar6 * dVar7 + dVar5 * dVar8 + *(double *)(local_150 + 8 + lVar17 * 0x10);
              }
            }
          }
        }
      }
      free(__ptr);
    }
  }
  if (local_48 != 0) {
    pnga_pgroup_sync((Integer)in_stack_fffffffffffff8e0);
  }
  return local_108;
}

Assistant:

Integer pnga_sprs_array_sprsdns_multiply(Integer s_a, Integer g_b, Integer trans)
{
  Integer lcnt;
  Integer icnt;
  Integer hdl_a = s_a+GA_OFFSET;
  Integer hdl_b = g_b+GA_OFFSET;
  Integer hdl_c;
  int local_sync_begin,local_sync_end;
  Integer elemsize;
  Integer idim, jdim;
  Integer i, j, k, l, m, n, nn;
  Integer nprocs = pnga_pgroup_nnodes(SPA[hdl_a].grp);
  Integer me = pnga_pgroup_nodeid(SPA[hdl_a].grp);
  Integer longidx;
  Integer type;
  Integer jhi, jlo;
  Integer gdims[2], blocks[2];
  Integer rowdim;
  Integer *count;
  Integer nblocks;
  Integer g_c;
  Integer two = 2;
  Integer ilen;
  Integer max_nnz_a, max_nnz_b;
  Integer *row_nnz;
  int64_t max_nnz;
  Integer *map, *size;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(SPA[hdl_a].grp);

  /* Do some initial verification to see if matrix multiply is possible */
  if (SPA[hdl_a].type != GA[hdl_b].type) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) types of sparse matrices"
    " A and B must match",0);
  }
  type = SPA[hdl_a].type;
  if (SPA[hdl_a].grp != GA[hdl_b].p_handle) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) matrices A and B must"
    " be on the same group",0);
  }
  if (GA[hdl_b].ndim != 2) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) matrix B must be"
    " of dimension 2",GA[hdl_b].ndim);
  }
  if ((trans && SPA[hdl_a].jdim != GA[hdl_b].dims[1]) ||
      (!trans && SPA[hdl_a].jdim != GA[hdl_b].dims[0])) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) column dimension of"
      " A must match row dimension of B",0);
  }
  if (SPA[hdl_a].idx_size == sizeof(int64_t)) {
    longidx = 1;
  } else {
    longidx = 0;
  }
  elemsize = SPA[hdl_a].size;
  idim = SPA[hdl_a].idim;
  if (trans) {
    jdim = GA[hdl_b].dims[0];
  } else {
    jdim = GA[hdl_b].dims[1];
  }
  /* Construct product array C*/
  pnga_mask_sync(local_sync_begin,local_sync_end);
  g_c = pnga_create_handle();
  hdl_c = g_c + GA_OFFSET;
  if (trans) {
    gdims[0] = jdim;
    gdims[1] = idim;
  } else {
    gdims[0] = idim;
    gdims[1] = jdim;
  }
  pnga_set_data(g_c,two,gdims,type);
  map = (Integer*)malloc((nprocs+1)*sizeof(Integer));
  size = (Integer*)malloc(nprocs*sizeof(Integer));
  for (i=0; i<nprocs; i++) size[i] = 0;
  size[me] = SPA[hdl_a].ihi-SPA[hdl_a].ilo+1;
  if (sizeof(Integer) == 8) {
    pnga_pgroup_gop(SPA[hdl_a].grp,C_LONG,size,nprocs,"+");
  } else {
    pnga_pgroup_gop(SPA[hdl_a].grp,C_INT,size,nprocs,"+");
  }
  if (trans) {
    map[0] = 1;
    map[1] = 1;
    for (i=1; i<nprocs; i++) {
      map[i+1] = map[i] + size[i-1];
    }
    blocks[0] = 1;
    blocks[1] = nprocs;
  } else {
    map[0] = 1;
    for (i=1; i<nprocs; i++) {
      map[i] = map[i-1] + size[i-1];
    }
    map[nprocs] = 1;
    blocks[0] = nprocs;
    blocks[1] = 1;
  }
  pnga_set_irreg_distr(g_c,map,blocks);
  pnga_set_pgroup(g_c,SPA[hdl_a].grp);
  pnga_mask_sync(local_sync_begin,local_sync_end);
  if (!pnga_allocate(g_c)) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) could not allocate"
      " product array C",0);
  }
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_zero(g_c);
  /* loop over processors in row to get target block and then loop over
   * processors to get all block pairs that contribute to target block.
   * Multiply block pairs */
  for (l=0; l<nprocs; l++) {
    /* Find bounding dimensions (unit-based) of target block in row */
    void *data_c;
    void *data_a, *data_b;
    Integer lo_c[2], hi_c[2], ld_c[2];
    Integer tlo_c[2], thi_c[2];
    lo_c[0] = SPA[hdl_a].ilo+1;
    hi_c[0] = SPA[hdl_a].ihi+1;
    pnga_sprs_array_column_distribution(s_a,l,&lo_c[1],&hi_c[1]);
    lo_c[1]++;
    hi_c[1]++;
    /* loop over all sub-blocks in column and row block that contribute
     * to target block */
    if (trans) {
      tlo_c[0] = lo_c[1];
      thi_c[0] = hi_c[1];
      tlo_c[1] = lo_c[0];
      thi_c[1] = hi_c[0];
    } else {
      tlo_c[0] = lo_c[0];
      thi_c[0] = hi_c[0];
      tlo_c[1] = lo_c[1];
      thi_c[1] = hi_c[1];
    }
    /* loop over non-zero blocks in row in sparse matrix A */
    for (nn=0; nn<SPA[hdl_a].nblocks; nn++) {
      void *iptr_a, *jptr_a;
      Integer ilo_a, ihi_a, jlo_a, jhi_a;
      Integer lo_b[2], hi_b[2], ld_b[2];
      Integer tlo_b[2], thi_b[2];
      void *val_a;
      void *buf_b;
      Integer nelem;
      Integer ii,jlen;
      n = SPA[hdl_a].blkidx[nn];
      /* calculate values of jlo and jhi for block in g_b */
      if (trans) {
        ld_c[0] = jdim;
        ld_c[1] = thi_c[1]-tlo_c[1]+1;
      } else {
        ld_c[0] = thi_c[0]-tlo_c[0]+1;
        ld_c[1] = jdim;
      }
      pnga_access_ptr(g_c,tlo_c,thi_c,&data_c,ld_c);
      /* Find block of A for multiplication */
      ilo_a = lo_c[0]-1;
      ihi_a = hi_c[0]-1;
      pnga_sprs_array_column_distribution(s_a, n, &jlo_a, &jhi_a);
      /* get pointer to sparse block */
      pnga_sprs_array_access_col_block(s_a, n, &iptr_a, &jptr_a, &val_a);
      lo_b[0] = jlo_a+1;
      hi_b[0] = jhi_a+1;
      lo_b[1] = lo_c[1];
      hi_b[1] = hi_c[1];
      if (trans) {
        tlo_b[0] = lo_b[1];
        thi_b[0] = hi_b[1];
        tlo_b[1] = lo_b[0];
        thi_b[1] = hi_b[0];
      } else {
        tlo_b[0] = lo_b[0];
        thi_b[0] = hi_b[0];
        tlo_b[1] = lo_b[1];
        thi_b[1] = hi_b[1];
      }
      /* Copy block from dense array into buffer */
      nelem = (thi_b[0]-tlo_b[0]+1)*(thi_b[1]-tlo_b[1]+1);
      buf_b = malloc(nelem*SPA[hdl_a].size);
      ld_b[0] = (thi_b[0]-tlo_b[0]+1);
      ld_b[1] = (thi_b[1]-tlo_b[1]+1);
      pnga_get(g_b,tlo_b,thi_b,buf_b,ld_b);
      if (SPA[hdl_a].idx_size == 4) {
        int *idx_a = (int*)iptr_a;
        int *jdx_a = (int*)jptr_a;
        data_a = val_a;
        /* now have access to blocks from A, B, and C. Perform block
         * multiplication */
        if (type == C_INT) {
          REAL_SPRSDNS_MULTIPLY_M(int,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_LONG) {
          REAL_SPRSDNS_MULTIPLY_M(long,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_LONGLONG) {
          REAL_SPRSDNS_MULTIPLY_M(long long,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_FLOAT) {
          REAL_SPRSDNS_MULTIPLY_M(float,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_DBL) {
          REAL_SPRSDNS_MULTIPLY_M(double,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_SCPL) {
          COMPLEX_SPRSDNS_MULTIPLY_M(float,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_DCPL) {
          COMPLEX_SPRSDNS_MULTIPLY_M(double,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        }
      } else {
        int64_t *idx_a = (int64_t*)iptr_a;
        int64_t *jdx_a = (int64_t*)jptr_a;
        data_a = val_a;
        /* now have access to blocks from A, B, and C. Perform block
         * multiplication */
        if (type == C_INT) {
          REAL_SPRSDNS_MULTIPLY_M(int,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_LONG) {
          REAL_SPRSDNS_MULTIPLY_M(long,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_LONGLONG) {
          REAL_SPRSDNS_MULTIPLY_M(long long,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_FLOAT) {
          REAL_SPRSDNS_MULTIPLY_M(float,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_DBL) {
          REAL_SPRSDNS_MULTIPLY_M(double,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_SCPL) {
          COMPLEX_SPRSDNS_MULTIPLY_M(float,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_DCPL) {
          COMPLEX_SPRSDNS_MULTIPLY_M(double,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        }
      }
      free(buf_b);
    }
  }
  if (local_sync_end) pnga_pgroup_sync(SPA[hdl_a].grp);
  return g_c;
}